

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

void convert_mods(iasctx *ctx,easm_mods *mods)

{
  int iVar1;
  litem *plVar2;
  litem **__ptr;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = mods->modsnum;
  if (0 < iVar6) {
    iVar4 = ctx->atomsnum;
    lVar5 = 0;
    do {
      plVar2 = (litem *)calloc(0x20,1);
      plVar2->type = LITEM_NAME;
      plVar2->str = mods->mods[lVar5]->str;
      iVar1 = ctx->atomsmax;
      __ptr = ctx->atoms;
      if (iVar1 <= iVar4) {
        iVar6 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar6 = 0x10;
        }
        ctx->atomsmax = iVar6;
        __ptr = (litem **)realloc(__ptr,(long)iVar6 << 3);
        ctx->atoms = __ptr;
        iVar4 = ctx->atomsnum;
        iVar6 = mods->modsnum;
      }
      lVar3 = (long)iVar4;
      iVar4 = iVar4 + 1;
      ctx->atomsnum = iVar4;
      __ptr[lVar3] = plVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar6);
  }
  return;
}

Assistant:

void convert_mods(struct iasctx *ctx, struct easm_mods *mods) {
	int i;
	for (i = 0; i < mods->modsnum; i++) {
		struct litem *li = calloc(sizeof *li, 1);
		li->type = LITEM_NAME;
		li->str = mods->mods[i]->str;
		ADDARRAY(ctx->atoms, li);
	}
}